

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O3

int sfd_tran_listener_setopt(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_stream_listener_set(*(nng_stream_listener **)((long)arg + 0x2d0),name,buf,sz,t);
  if (iVar1 == 9) {
    iVar1 = nni_setopt(sfd_tran_ep_opts,name,arg,buf,sz,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
sfd_tran_listener_setopt(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	sfd_tran_ep *ep = arg;
	int          rv;

	rv = nni_stream_listener_set(ep->listener, name, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_setopt(sfd_tran_ep_opts, name, ep, buf, sz, t);
	}
	return (rv);
}